

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O3

uint32_t __thiscall
spirv_cross::CompilerHLSL::type_to_consumed_locations(CompilerHLSL *this,SPIRType *type)

{
  uint32_t uVar1;
  SPIRType *type_00;
  uint32_t uVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (type->basetype == Struct) {
    if ((int)(type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
             buffer_size == 0) {
      uVar2 = 0;
    }
    else {
      uVar4 = 0;
      uVar2 = 0;
      do {
        type_00 = Variant::get<spirv_cross::SPIRType>
                            ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                             super_VectorView<spirv_cross::Variant>.ptr +
                             (type->member_types).
                             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
                             [uVar4].id);
        uVar1 = type_to_consumed_locations(this,type_00);
        uVar2 = uVar2 + uVar1;
        uVar4 = uVar4 + 1;
      } while (uVar4 < (uint)(type->member_types).
                             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
                             buffer_size);
    }
  }
  else {
    uVar4 = (ulong)(uint)(type->array).super_VectorView<unsigned_int>.buffer_size;
    iVar3 = 1;
    if (uVar4 != 0) {
      uVar5 = 0;
      do {
        uVar2 = (type->array).super_VectorView<unsigned_int>.ptr[uVar5];
        if ((type->array_size_literal).super_VectorView<bool>.ptr[uVar5] == false) {
          uVar2 = Compiler::evaluate_constant_u32((Compiler *)this,uVar2);
          uVar4 = (ulong)(uint)(type->array).super_VectorView<unsigned_int>.buffer_size;
        }
        iVar3 = iVar3 * uVar2;
        uVar5 = uVar5 + 1;
      } while (uVar5 < uVar4);
    }
    uVar2 = iVar3 * type->columns;
  }
  return uVar2;
}

Assistant:

uint32_t CompilerHLSL::type_to_consumed_locations(const SPIRType &type) const
{
	// TODO: Need to verify correctness.
	uint32_t elements = 0;

	if (type.basetype == SPIRType::Struct)
	{
		for (uint32_t i = 0; i < uint32_t(type.member_types.size()); i++)
			elements += type_to_consumed_locations(get<SPIRType>(type.member_types[i]));
	}
	else
	{
		uint32_t array_multiplier = 1;
		for (uint32_t i = 0; i < uint32_t(type.array.size()); i++)
		{
			if (type.array_size_literal[i])
				array_multiplier *= type.array[i];
			else
				array_multiplier *= evaluate_constant_u32(type.array[i]);
		}
		elements += array_multiplier * type.columns;
	}
	return elements;
}